

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O0

void (anonymous_namespace)::
     lexAndParseExpression<capnp::TextCodec::decode(kj::StringPtr,capnp::Type,capnp::Orphanage)const::__0>
               (StringPtr input,anon_class_24_3_d091ff59 f)

{
  StructDataBitCount *this;
  Builder result;
  Reader expression_00;
  bool bVar1;
  Parsers *pPVar2;
  NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *other;
  Orphan<capnp::compiler::Expression> *pOVar3;
  ArrayPtr<const_char> input_00;
  Orphanage orphanageParam;
  Iterator IVar4;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  IVar5;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  end;
  Fault local_5a0;
  Fault f_3;
  Reader local_588;
  Fault local_558;
  Fault f_2;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_540;
  Reader *local_530;
  uint local_528;
  undefined1 local_520 [8];
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  best;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  Fault local_4e0;
  Fault f_1;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_4c8;
  Reader *local_4b8;
  uint local_4b0;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_4a8;
  Maybe<capnp::Orphan<capnp::compiler::Expression>_> local_498;
  undefined1 local_470 [8];
  NullableValue<capnp::Orphan<capnp::compiler::Expression>_> expression;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_438;
  Reader *local_428;
  uint local_420;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_418;
  Reader *local_408;
  uint local_400;
  Reader *local_3f8;
  uint local_3f0;
  Reader *local_3e8;
  uint local_3e0;
  Reader *local_3d8;
  uint local_3d0;
  undefined1 local_3c8 [8];
  ParserInput parserInput;
  undefined1 local_360 [8];
  Reader tokens;
  undefined1 local_320 [8];
  CapnpParser parser;
  undefined1 auStack_138 [8];
  Builder lexedTokens;
  MallocMessageBuilder tokenArena;
  ThrowingErrorReporter errorReporter;
  StringPtr input_local;
  
  errorReporter.super_ErrorReporter._vptr_ErrorReporter = (ErrorReporter)input.content.ptr;
  anon_unknown.dwarf_4e7c20::ThrowingErrorReporter::ThrowingErrorReporter
            ((ThrowingErrorReporter *)&tokenArena.moreSegments.builder.disposer);
  this = &lexedTokens._builder.dataSize;
  capnp::MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this,0x400,GROW_HEURISTICALLY);
  capnp::MessageBuilder::initRoot<capnp::compiler::LexedTokens>
            ((Builder *)auStack_138,(MessageBuilder *)this);
  input_00 = kj::StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&errorReporter);
  parser.parsers.annotationDecl.wrapper = (Wrapper *)auStack_138;
  result._builder.capTable = (CapTableBuilder *)lexedTokens._builder.segment;
  result._builder.segment = (SegmentBuilder *)auStack_138;
  result._builder.data = lexedTokens._builder.capTable;
  result._builder.pointers = (WirePointer *)lexedTokens._builder.data;
  result._builder._32_8_ = lexedTokens._builder.pointers;
  capnp::compiler::lex(input_00,result,(ErrorReporter *)&tokenArena.moreSegments.builder.disposer);
  orphanageParam =
       capnp::MessageBuilder::getOrphanage((MessageBuilder *)&lexedTokens._builder.dataSize);
  tokens.reader._40_8_ = orphanageParam.arena;
  capnp::compiler::CapnpParser::CapnpParser
            ((CapnpParser *)local_320,orphanageParam,
             (ErrorReporter *)&tokenArena.moreSegments.builder.disposer);
  capnp::compiler::LexedTokens::Builder::asReader
            ((Reader *)&parserInput.best.index,(Builder *)auStack_138);
  capnp::compiler::LexedTokens::Reader::getTokens
            ((Reader *)local_360,(Reader *)&parserInput.best.index);
  IVar4 = capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::begin((Reader *)local_360);
  local_3e8 = IVar4.container;
  local_3e0 = IVar4.index;
  local_3d8 = local_3e8;
  local_3d0 = local_3e0;
  IVar4 = capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end((Reader *)local_360);
  local_408 = IVar4.container;
  local_400 = IVar4.index;
  IVar5.index = local_3d0;
  IVar5.container = local_3d8;
  IVar5._12_4_ = 0;
  end._12_4_ = 0;
  end.container = (Reader *)SUB128(IVar4._0_12_,0);
  end.index = SUB124(IVar4._0_12_,8);
  local_3f8 = local_408;
  local_3f0 = local_400;
  kj::parse::
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  ::IteratorInput((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                   *)local_3c8,IVar5,end);
  IVar5 = kj::parse::
          IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
          ::getPosition((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                         *)local_3c8);
  local_428 = IVar5.container;
  local_420 = IVar5.index;
  local_418.container = local_428;
  local_418.index = local_420;
  IVar4 = capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end((Reader *)local_360);
  expression.field_1.value.builder.location = (word *)IVar4.container;
  local_438.index = IVar4.index;
  local_438.container = (Reader *)expression.field_1.value.builder.location;
  bVar1 = capnp::_::
          IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
          ::operator!=(&local_418,&local_438);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              (&local_5a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
               ,0x57,FAILED,(char *)0x0,"\"Failed to read input.\"",
               (char (*) [22])"Failed to read input.");
    kj::_::Debug::Fault::fatal(&local_5a0);
  }
  pPVar2 = capnp::compiler::CapnpParser::getParsers((CapnpParser *)local_320);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
  ::operator()(&local_498,&pPVar2->expression,
               (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                *)local_3c8);
  other = kj::_::readMaybe<capnp::Orphan<capnp::compiler::Expression>>(&local_498);
  kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::NullableValue
            ((NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *)local_470,other);
  kj::Maybe<capnp::Orphan<capnp::compiler::Expression>_>::~Maybe(&local_498);
  pOVar3 = kj::_::NullableValue::operator_cast_to_Orphan_((NullableValue *)local_470);
  if (pOVar3 == (Orphan<capnp::compiler::Expression> *)0x0) {
    IVar5 = kj::parse::
            IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
            ::getBest((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                       *)local_3c8);
    local_530 = IVar5.container;
    local_528 = IVar5.index;
    local_520 = (undefined1  [8])local_530;
    best.container._0_4_ = local_528;
    IVar4 = capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end((Reader *)local_360);
    f_2.exception = (Exception *)IVar4.container;
    local_540.index = IVar4.index;
    local_540.container = (Reader *)f_2.exception;
    bVar1 = capnp::_::
            IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
            ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                          *)local_520,&local_540);
    if (bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                (&local_558,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x51,FAILED,(char *)0x0,"\"Premature end of input.\"",
                 (char (*) [24])"Premature end of input.");
      kj::_::Debug::Fault::fatal(&local_558);
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
    ::operator*(&local_588,
                (IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                 *)local_520);
    kj::StringPtr::StringPtr((StringPtr *)&f_3,"Parse error");
    capnp::compiler::ErrorReporter::addErrorOn<capnp::compiler::Token::Reader>
              ((ErrorReporter *)&tokenArena.moreSegments.builder.disposer,&local_588,(StringPtr)_f_3
              );
  }
  else {
    IVar5 = kj::parse::
            IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
            ::getPosition((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                           *)local_3c8);
    local_4b8 = IVar5.container;
    local_4b0 = IVar5.index;
    local_4a8.container = local_4b8;
    local_4a8.index = local_4b0;
    IVar4 = capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end((Reader *)local_360);
    f_1.exception = (Exception *)IVar4.container;
    local_4c8.index = IVar4.index;
    local_4c8.container = (Reader *)f_1.exception;
    bVar1 = capnp::_::
            IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
            ::operator==(&local_4a8,&local_4c8);
    if (!bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                (&local_4e0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x4b,FAILED,"parserInput.getPosition() == tokens.end()",
                 "\"Extra tokens in input.\"",(char (*) [23])"Extra tokens in input.");
      kj::_::Debug::Fault::fatal(&local_4e0);
    }
    pOVar3 = kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::operator->
                       ((NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *)local_470);
    capnp::Orphan<capnp::compiler::Expression>::getReader
              ((ReaderFor<capnp::compiler::Expression> *)&best.index,pOVar3);
    expression_00._reader.capTable = (CapTableReader *)uStack_508;
    expression_00._reader.segment = (SegmentReader *)best._8_8_;
    expression_00._reader.data = (void *)local_500;
    expression_00._reader.pointers = (WirePointer *)uStack_4f8;
    expression_00._reader._32_8_ = local_4f0;
    expression_00._reader._40_8_ = uStack_4e8;
    capnp::TextCodec::decode::anon_class_24_3_d091ff59::operator()(&f,expression_00);
  }
  kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::~NullableValue
            ((NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *)local_470);
  kj::parse::
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  ::~IteratorInput((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                    *)local_3c8);
  capnp::compiler::CapnpParser::~CapnpParser((CapnpParser *)local_320);
  capnp::MallocMessageBuilder::~MallocMessageBuilder
            ((MallocMessageBuilder *)&lexedTokens._builder.dataSize);
  return;
}

Assistant:

void lexAndParseExpression(kj::StringPtr input, Function f) {
  // Parses a single expression from the input and calls `f(expression)`.

  ThrowingErrorReporter errorReporter;

  capnp::MallocMessageBuilder tokenArena;
  auto lexedTokens = tokenArena.initRoot<capnp::compiler::LexedTokens>();
  capnp::compiler::lex(input, lexedTokens, errorReporter);

  capnp::compiler::CapnpParser parser(tokenArena.getOrphanage(), errorReporter);
  auto tokens = lexedTokens.asReader().getTokens();
  capnp::compiler::CapnpParser::ParserInput parserInput(tokens.begin(), tokens.end());

  if (parserInput.getPosition() != tokens.end()) {
    KJ_IF_MAYBE(expression, parser.getParsers().expression(parserInput)) {
      // The input is expected to contain a *single* message.
      KJ_REQUIRE(parserInput.getPosition() == tokens.end(), "Extra tokens in input.");

      f(expression->getReader());
    } else {
      auto best = parserInput.getBest();
      if (best == tokens.end()) {
        KJ_FAIL_REQUIRE("Premature end of input.");
      } else {
        errorReporter.addErrorOn(*best, "Parse error");
      }
    }
  }